

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O0

char * find_roman_suffix_start(char *buf)

{
  char *local_20;
  char *p;
  char *start;
  char *buf_local;
  
  p = strrchr(buf,0x20);
  if (p != (char *)0x0) {
    p = p + 1;
    for (local_20 = p; *local_20 != '\0'; local_20 = local_20 + 1) {
      if ((((*local_20 != 'I') && (*local_20 != 'V')) && (*local_20 != 'X')) &&
         (((*local_20 != 'L' && (*local_20 != 'C')) && ((*local_20 != 'D' && (*local_20 != 'M'))))))
      {
        return (char *)0x0;
      }
    }
  }
  return p;
}

Assistant:

char *find_roman_suffix_start(const char *buf)
{
	const char *start = strrchr(buf, ' ');
	const char *p;
	
	if (start) {
		start++;
		p = start;
		while (*p) {
			if (*p != 'I' && *p != 'V' && *p != 'X' && *p != 'L' &&
			    *p != 'C' && *p != 'D' && *p != 'M') {
				start = NULL;
				break;
			}
			++p;			    
		}
	}
	return (char *)start;
}